

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O0

void * foxxll::linuxaio_queue::wait_async(void *arg)

{
  value_type local_1c;
  self_type *local_18;
  self_type *pthis;
  void *arg_local;
  
  pthis = (self_type *)arg;
  wait_requests((linuxaio_queue *)arg);
  local_18 = pthis;
  local_1c = TERMINATED;
  shared_state<foxxll::request_queue_impl_worker::thread_state>::set_to
            (&pthis->wait_thread_state_,&local_1c);
  return (void *)0x0;
}

Assistant:

void* linuxaio_queue::wait_async(void* arg)
{
    (static_cast<linuxaio_queue*>(arg))->wait_requests();

    self_type* pthis = static_cast<self_type*>(arg);
    pthis->wait_thread_state_.set_to(TERMINATED);

#if FOXXLL_MSVC >= 1700 && FOXXLL_MSVC <= 1800
    // Workaround for deadlock bug in Visual C++ Runtime 2012 and 2013, see
    // request_queue_impl_worker.cpp. -tb
    ExitThread(nullptr);
#else
    return nullptr;
#endif
}